

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcryptographichash.cpp
# Opt level: O2

void __thiscall
QMessageAuthenticationCodePrivate::setKey
          (QMessageAuthenticationCodePrivate *this,QByteArrayView newKey)

{
  QCryptographicHashPrivate *this_00;
  ulong uVar1;
  long in_FS_OFFSET;
  QByteArrayView local_30;
  long local_20;
  
  local_30.m_data = newKey.m_data;
  local_30.m_size = newKey.m_size;
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = (ulong)(this->messageHash).method;
  if (uVar1 < 0x17) {
    uVar1 = *(ulong *)(&DAT_00518c90 + uVar1 * 8);
  }
  else {
    uVar1 = 0;
  }
  if ((long)uVar1 < local_30.m_size) {
    this_00 = &this->messageHash;
    QCryptographicHashPrivate::addData(this_00,newKey);
    QCryptographicHashPrivate::finalizeUnchecked(this_00);
    QSmallByteArray<144ul>::assign<QSmallByteArray<64ul>>
              ((QSmallByteArray<144ul> *)this,&(this->messageHash).result);
    QCryptographicHashPrivate::reset(this_00);
  }
  else {
    QSmallByteArray<144UL>::assign<QByteArrayView>(&this->key,&local_30);
  }
  if ((this->key).m_size < uVar1) {
    QSmallByteArray<144UL>::resize(&this->key,uVar1,'\0');
  }
  initMessageHash(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMessageAuthenticationCodePrivate::setKey(QByteArrayView newKey) noexcept
{
    const int blockSize = qt_hash_block_size(messageHash.method);

    if (newKey.size() > blockSize) {
        messageHash.addData(newKey);
        messageHash.finalizeUnchecked();
        static_assert([] {
                using A = QCryptographicHash::Algorithm;
                for (int i = 0; i < A::NumAlgorithms; ++i) {
                    if (hashLengthInternal(A(i)) > qt_hash_block_size(A(i)))
                        return false;
                }
                return true;
            }(), "this code assumes that a hash's result always fits into that hash's block size");
        key = messageHash.result;
        messageHash.reset();
    } else {
        key.assign(newKey);
    }

    if (key.size() < blockSize)
        key.resize(blockSize, '\0');

    initMessageHash();
}